

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

void fiber_reserve_return(Fiber *fbr,FiberFunc f,void **args_dest,size_t args_size)

{
  _Bool _Var1;
  size_t pgsz_00;
  void *hu_c_implicit_cast_val__COUNTER___2;
  void *hu_c_implicit_cast_val__COUNTER___1;
  size_t pgsz;
  size_t arg_align;
  char *hu_c_implicit_cast_val__COUNTER__;
  char *sp;
  size_t args_size_local;
  void **args_dest_local;
  FiberFunc f_local;
  Fiber *fbr_local;
  
  sp = (char *)args_size;
  args_size_local = (size_t)args_dest;
  args_dest_local = (void **)f;
  f_local = (FiberFunc)fbr;
  _Var1 = fiber_is_executing(fbr);
  if (_Var1) {
    __assert_fail("!fiber_is_executing(fbr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c",
                  0x145,"void fiber_reserve_return(Fiber *, FiberFunc, void **, size_t)");
  }
  hu_c_implicit_cast_val__COUNTER__ = *(char **)f_local;
  hu_c_implicit_cast_val__COUNTER__ =
       stack_align_n(hu_c_implicit_cast_val__COUNTER__ + -(long)sp,0x10);
  *(char **)args_size_local = hu_c_implicit_cast_val__COUNTER__;
  pgsz_00 = get_page_size();
  if ((char *)(pgsz_00 - 100) < sp) {
    probe_stack(hu_c_implicit_cast_val__COUNTER__,(size_t)sp,pgsz_00);
  }
  _Var1 = is_stack_aligned(hu_c_implicit_cast_val__COUNTER__);
  if (!_Var1) {
    __assert_fail("is_stack_aligned(sp)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c",
                  0x151,"void fiber_reserve_return(Fiber *, FiberFunc, void **, size_t)");
  }
  push(&hu_c_implicit_cast_val__COUNTER__,*(void **)(f_local + 8));
  push(&hu_c_implicit_cast_val__COUNTER__,*(void **)f_local);
  push(&hu_c_implicit_cast_val__COUNTER__,args_dest_local);
  push(&hu_c_implicit_cast_val__COUNTER__,*(void **)args_size_local);
  _Var1 = is_stack_aligned(hu_c_implicit_cast_val__COUNTER__);
  if (!_Var1) {
    __assert_fail("is_stack_aligned(sp)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c",
                  0x158,"void fiber_reserve_return(Fiber *, FiberFunc, void **, size_t)");
  }
  *(code **)(f_local + 8) = fiber_asm_invoke;
  *(char **)f_local = hu_c_implicit_cast_val__COUNTER__;
  return;
}

Assistant:

void
fiber_reserve_return(Fiber *fbr,
                     FiberFunc f,
                     void **args_dest,
                     size_t args_size)
{
    NULL_CHECK(fbr, "Fiber cannot be NULL");
    assert(!fiber_is_executing(fbr));

    char *sp = hu_cxx_static_cast(char *, fbr->regs.sp);
    size_t arg_align =
      ARG_ALIGNMENT > STACK_ALIGNMENT ? ARG_ALIGNMENT : STACK_ALIGNMENT;
    sp = stack_align_n(sp - args_size, arg_align);
    *args_dest = sp;

    size_t pgsz = get_page_size();
    if (hu_unlikely(args_size > pgsz - 100))
        probe_stack(sp, args_size, pgsz);

    assert(is_stack_aligned(sp));

    push(&sp, fbr->regs.lr);
    push(&sp, fbr->regs.sp);
    push(&sp, hu_cxx_reinterpret_cast(void *, f));
    push(&sp, *args_dest);

    assert(is_stack_aligned(sp));

    fbr->regs.lr = hu_cxx_reinterpret_cast(void *, fiber_asm_invoke);

    fbr->regs.sp = (void *) sp;
}